

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall libserver::server::_display_message(server *this,string *_display_msg)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->client_name)._M_dataplus._M_p,
                      (this->client_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(_display_msg->_M_dataplus)._M_p,_display_msg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void libserver::server::_display_message(const std::string& _display_msg)
{
    // Display a nice formatted message
    std::cout<<client_name<<" : "<<_display_msg<<std::endl;
}